

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

int Dau_InsertFunction(Abc_TtHieMan_t *pMan,word *pCur,int nNodes,int nInputs,int nVars0,int nVars,
                      Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,abctime clk)

{
  uint nVars_00;
  int iVar1;
  int iVar2;
  int Entry;
  int nEntries;
  uint Phase;
  int nVarsNew;
  char Perm [16];
  int DumpDelta;
  int nVars_local;
  int nVars0_local;
  int nInputs_local;
  int nNodes_local;
  word *pCur_local;
  Abc_TtHieMan_t *pMan_local;
  
  builtin_strncpy(Perm + 0xc,"@B\x0f",4);
  memset(&Phase,0,0x10);
  nVars_00 = Abc_TtMinBase(pCur,(int *)0x0,nVars,nInputs);
  Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda,pMan,pCur,nVars_00,(char *)&Phase,99);
  iVar1 = Vec_MemEntryNum(vTtMem);
  Vec_MemHashInsert(vTtMem,pCur);
  iVar2 = Vec_MemEntryNum(vTtMem);
  if (iVar1 == iVar2) {
    pMan_local._4_4_ = 0;
  }
  else {
    Vec_IntPush(vNodSup,nNodes << 0x10 | nVars_00);
    iVar1 = Vec_MemEntryNum(vTtMem);
    iVar2 = Vec_IntSize(vNodSup);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                    ,0x269,
                    "int Dau_InsertFunction(Abc_TtHieMan_t *, word *, int, int, int, int, Vec_Mem_t *, Vec_Int_t *, int, abctime)"
                   );
    }
    iVar1 = Vec_IntSize(vNodSup);
    if (iVar1 % (int)Perm._12_4_ == 0) {
      Dau_TablesSave(nInputs,nVars0,vTtMem,vNodSup,nFronts,clk);
    }
    pMan_local._4_4_ = 1;
  }
  return pMan_local._4_4_;
}

Assistant:

int Dau_InsertFunction( Abc_TtHieMan_t * pMan, word * pCur, int nNodes, int nInputs, int nVars0, int nVars, 
    Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    int DumpDelta = 1000000;
    char Perm[16] = {0};
    int nVarsNew = Abc_TtMinBase( pCur, NULL, nVars, nInputs );
    //unsigned Phase = Abc_TtCanonicizeHie( pMan, pCur, nVarsNew, Perm, 1 );
    unsigned Phase = Abc_TtCanonicizeWrap( Abc_TtCanonicizeAda, pMan, pCur, nVarsNew, Perm, 99 );
    int nEntries = Vec_MemEntryNum(vTtMem);
    int Entry = Vec_MemHashInsert( vTtMem, pCur );
    if ( nEntries == Vec_MemEntryNum(vTtMem) ) // found in the table - not new
        return 0;
    Entry = 0;
    Phase = 0;
    // this is a new class
    Vec_IntPush( vNodSup, (nNodes << 16) | nVarsNew );
    assert( Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup) );
    if ( Vec_IntSize(vNodSup) % DumpDelta == 0 )
        Dau_TablesSave( nInputs, nVars0, vTtMem, vNodSup, nFronts, clk );
    return 1;
}